

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O2

void __thiscall Hpipe::BranchSet::BranchSet(BranchSet *this,Vec<Hpipe::BranchSet::Range> *ranges)

{
  pointer pRVar1;
  pointer pRVar2;
  long lVar3;
  ulong uVar4;
  Node *obj;
  __normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
  __i;
  pointer pRVar5;
  
  (this->root).data = (Node *)0x0;
  pRVar1 = (ranges->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
           .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (ranges->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
           .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar1 != pRVar2) {
    uVar4 = (long)pRVar2 - (long)pRVar1 >> 5;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::BranchSet::_Iter_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
              (pRVar1,pRVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pRVar2 - (long)pRVar1 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::BranchSet::_Iter_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
                (pRVar1,pRVar2);
    }
    else {
      pRVar5 = pRVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::BranchSet::_Iter_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
                (pRVar1,pRVar5);
      for (; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,__gnu_cxx::__ops::_Val_comp_iter<Hpipe::BranchSet::_Val_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
                  (pRVar5);
      }
    }
  }
  obj = make_choice(this,ranges);
  AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator=(&this->root,obj);
  return;
}

Assistant:

BranchSet::BranchSet( Vec<Range> ranges ) {
    std::sort( ranges.begin(), ranges.end(), []( const Range &a, const Range &b ) {
        return a.beg < b.beg;
    } );

    root = make_choice( ranges );
    cost_and_freq( root.ptr(), 0 );
}